

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_vacuum.cpp
# Opt level: O3

void __thiscall duckdb::VacuumLocalSinkState::~VacuumLocalSinkState(VacuumLocalSinkState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__VacuumLocalSinkState_02469460;
  p_Var1 = (this->hashes).auxiliary.internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->hashes).buffer.internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->hashes).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
           .
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  LogicalType::~LogicalType(&(this->hashes).type);
  ::std::
  vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  ::~vector(&(this->column_distinct_stats).
             super_vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
           );
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_024465d8;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

explicit VacuumLocalSinkState(VacuumInfo &info, optional_ptr<TableCatalogEntry> table) : hashes(LogicalType::HASH) {
		for (const auto &column_name : info.columns) {
			auto &column = table->GetColumn(column_name);
			if (DistinctStatistics::TypeIsSupported(column.GetType())) {
				column_distinct_stats.push_back(make_uniq<DistinctStatistics>());
			} else {
				column_distinct_stats.push_back(nullptr);
			}
		}
	}